

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidget::removeRow(QTableWidget *this,int row)

{
  QTableModel *pQVar1;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QTableWidgetPrivate *d;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTableWidget *)0x8dc499);
  pQVar1 = QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dc4a8);
  QModelIndex::QModelIndex((QModelIndex *)0x8dc4c4);
  (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,in_ESI,1,local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::removeRow(int row)
{
    Q_D(QTableWidget);
    d->tableModel()->removeRows(row);
}